

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_gate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  ROOM_INDEX_DATA *pRVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  CHAR_DATA *ch_00;
  char *txt;
  
  if (ch->fighting != (CHAR_DATA *)0x0) {
    txt = "You can\'t concentrate enough.\n\r";
    goto LAB_002b34bd;
  }
  ch_00 = get_char_world(ch,target_name);
  if (ch_00 != (CHAR_DATA *)0x0) {
    bVar3 = is_npc(ch_00);
    iVar5 = level;
    if ((bVar3) && (iVar5 = level + -5, (ch_00->res_flags[0] & 1) == 0)) {
      iVar5 = level;
    }
    bVar3 = is_npc(ch_00);
    level = iVar5;
    if ((bVar3) && (level = iVar5 + 5, (ch_00->vuln_flags[0] & 1) == 0)) {
      level = iVar5;
    }
  }
  if (((ch_00 != ch && ch_00 != (CHAR_DATA *)0x0) && (ch_00->in_room != (ROOM_INDEX_DATA *)0x0)) &&
     (bVar3 = can_see_room(ch,ch_00->in_room), bVar3)) {
    pRVar2 = ch_00->in_room;
    uVar4 = (uint)pRVar2->room_flags[0];
    if ((((pRVar2->room_flags[0] & 0x100600U) == 0) && (pRVar2->area->area_type != 5)) &&
       ((ch->in_room->guild == 0 && (pRVar2->guild == 0)))) {
      if (pRVar2->cabal == 0) {
        if ((uVar4 >> 0xb & 1) == 0) goto LAB_002b34f3;
      }
      else if (((uVar4 >> 0xb & 1) == 0) && (pRVar2->cabal == ch->cabal)) {
LAB_002b34f3:
        if (((((((uVar4 >> 0xd & 1) == 0) &&
               (((ch->in_room->room_flags[0] & 0x2000) == 0 && ((int)ch_00->level < level + 4)))) &&
              ((bVar3 = is_npc(ch_00), bVar3 ||
               ((bVar3 = can_pk(ch,ch_00), bVar3 || ((ch_00->act[0] & 0x10000) == 0)))))) &&
             (((bVar3 = is_npc(ch_00), bVar3 || (bVar3 = saves_spell(level,ch_00,0x10), !bVar3)) &&
              ((bVar3 = is_npc(ch_00), bVar3 || (ch_00->level < 0x34)))))) &&
            ((bVar3 = is_npc(ch_00), !bVar3 || ((ch_00->imm_flags[0] & 1) == 0)))) &&
           ((((bVar3 = is_npc(ch_00), !bVar3 || (bVar3 = saves_spell(level,ch_00,0x10), !bVar3)) &&
             ((bVar3 = is_affected_room(ch->in_room,(int)gsn_plasma_cube), !bVar3 ||
              (iVar5 = number_percent(), 0x31 < iVar5)))) &&
            ((bVar3 = is_affected_room(ch_00->in_room,(int)gsn_plasma_cube), !bVar3 ||
             (iVar5 = number_percent(), 0x31 < iVar5)))))) {
          bVar3 = is_affected(ch,(int)gsn_bind_feet);
          if (bVar3) {
            txt = "Your feet are rooted to the ground!\n\r";
          }
          else {
            sVar1 = ch_00->in_room->cabal;
            if ((sVar1 == 0) || (sVar1 == ch_00->cabal)) {
              if ((ch->pet != (CHAR_DATA *)0x0) && (ch->in_room == ch->pet->in_room)) {
                un_blade_barrier(ch,(char *)0x0);
                act("$n steps through a gate and vanishes.",ch,(void *)0x0,(void *)0x0,0);
                send_to_char("You step through a gate and vanish.\n\r",ch);
                char_from_room(ch);
                char_to_room(ch,ch_00->in_room);
                act("$n has arrived through a gate.",ch,(void *)0x0,(void *)0x0,0);
                do_look(ch,"auto");
                check_plasma_thread(ch,-1);
                act("$n steps through a gate and vanishes.",ch->pet,(void *)0x0,(void *)0x0,0);
                send_to_char("You step through a gate and vanish.\n\r",ch->pet);
                char_from_room(ch->pet);
                char_to_room(ch->pet,ch_00->in_room);
                act("$n has arrived through a gate.",ch->pet,(void *)0x0,(void *)0x0,0);
                do_look(ch->pet,"auto");
                return;
              }
              un_blade_barrier(ch,(char *)0x0);
              act("$n steps through a gate and vanishes.",ch,(void *)0x0,(void *)0x0,0);
              send_to_char("You step through a gate and vanish.\n\r",ch);
              char_from_room(ch);
              char_to_room(ch,ch_00->in_room);
              act("$n has arrived through a gate.",ch,(void *)0x0,(void *)0x0,0);
              do_look(ch,"auto");
              check_plasma_thread(ch,-1);
              return;
            }
            txt = "You failed.\n\r";
            ch = ch_00;
          }
          goto LAB_002b34bd;
        }
      }
    }
  }
  txt = "You failed.\n\r";
LAB_002b34bd:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_gate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	bool gate_pet;

	if (ch->fighting != nullptr)
	{
		send_to_char("You can't concentrate enough.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, target_name);

	if (!(victim == nullptr))
	{
		if ((is_npc(victim)) && (IS_SET(victim->res_flags, RES_SUMMON)))
			level -= 5;

		if ((is_npc(victim)) && (IS_SET(victim->vuln_flags, VULN_SUMMON)))
			level += 5;
	}

	if (victim == nullptr
		|| victim == ch
		|| victim->in_room == nullptr
		|| !can_see_room(ch, victim->in_room)
		|| IS_SET(victim->in_room->room_flags, ROOM_NO_GATE)
		|| IS_SET(victim->in_room->room_flags, ROOM_SAFE)
		|| IS_SET(victim->in_room->room_flags, ROOM_PRIVATE)
		|| victim->in_room->area->area_type == ARE_UNOPENED
		|| ch->in_room->guild != 0
		|| victim->in_room->guild != 0
		|| (victim->in_room->cabal != 0 && victim->in_room->cabal != ch->cabal)
		|| IS_SET(victim->in_room->room_flags, ROOM_SOLITARY)
		|| IS_SET(victim->in_room->room_flags, ROOM_NO_RECALL)
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL)
		|| victim->level >= level + 4
		|| (!is_npc(victim) && !can_pk(ch, victim) && IS_SET(victim->act, PLR_NOSUMMON))
		|| (!is_npc(victim) && saves_spell(level, victim, DAM_OTHER))
		|| (!is_npc(victim) && victim->level > LEVEL_HERO) /* NOT trust */
		|| (is_npc(victim) && IS_SET(victim->imm_flags, IMM_SUMMON))
		|| (is_npc(victim) && saves_spell(level, victim, DAM_OTHER))
		|| (is_affected_room(ch->in_room, gsn_plasma_cube) && number_percent() < 50)
		|| (is_affected_room(victim->in_room, gsn_plasma_cube) && number_percent() < 50))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_bind_feet))
	{
		send_to_char("Your feet are rooted to the ground!\n\r", ch);
		return;
	}

	if (victim->in_room->cabal != 0 && victim->in_room->cabal != victim->cabal)
	{
		send_to_char("You failed.\n\r", victim);
		return;
	}

	if (ch->pet != nullptr && ch->in_room == ch->pet->in_room)
		gate_pet = true;
	else
		gate_pet = false;

	un_blade_barrier(ch, nullptr);

	act("$n steps through a gate and vanishes.", ch, nullptr, nullptr, TO_ROOM);

	send_to_char("You step through a gate and vanish.\n\r", ch);
	char_from_room(ch);
	char_to_room(ch, victim->in_room);

	act("$n has arrived through a gate.", ch, nullptr, nullptr, TO_ROOM);
	do_look(ch, "auto");
	check_plasma_thread(ch, -1);

	if (gate_pet)
	{
		act("$n steps through a gate and vanishes.", ch->pet, nullptr, nullptr, TO_ROOM);
		send_to_char("You step through a gate and vanish.\n\r", ch->pet);

		char_from_room(ch->pet);
		char_to_room(ch->pet, victim->in_room);

		act("$n has arrived through a gate.", ch->pet, nullptr, nullptr, TO_ROOM);
		do_look(ch->pet, "auto");
	}
}